

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
fmt::v8::detail::specs_handler<char>::get_arg
          (format_arg *__return_storage_ptr__,specs_handler<char> *this,undefined8 param_3,
          int param_4)

{
  uint uVar1;
  basic_format_parse_context<char,_fmt::v8::detail::error_handler> *this_00;
  buffer_context<char> *this_01;
  
  this_00 = this->parse_context_;
  uVar1 = this_00->next_arg_id_;
  if (-1 < (int)uVar1) {
    this_01 = this->context_;
    this_00->next_arg_id_ = uVar1 + 1;
    get_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>,int>
              (__return_storage_ptr__,(detail *)this_01,
               (basic_format_context<fmt::v8::appender,_char> *)(ulong)uVar1,param_4);
    return __return_storage_ptr__;
  }
  error_handler::on_error
            ((error_handler *)this_00,"cannot switch from manual to automatic argument indexing");
}

Assistant:

FMT_CONSTEXPR auto get_arg(auto_id) -> format_arg {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }